

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_uu.c
# Opt level: O2

ssize_t bid_get_line(archive_read_filter *filter,uchar **b,ssize_t *avail,ssize_t *ravail,
                    ssize_t *nl,size_t *nbytes_read)

{
  size_t sVar1;
  bool bVar2;
  ssize_t sVar3;
  uchar *puVar4;
  ssize_t sVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  
  if (*avail == 0) {
    *nl = 0;
    sVar3 = 0;
  }
  else {
    sVar3 = get_line(*b,*avail,nl);
  }
  bVar2 = false;
  while( true ) {
    if (*nl != 0) {
      return sVar3;
    }
    if (bVar2) {
      return sVar3;
    }
    if (sVar3 != *avail) {
      return sVar3;
    }
    if (0x1ffff < *nbytes_read) break;
    lVar6 = *ravail;
    uVar7 = (ulong)((int)lVar6 + 0x3ffU & 0xfffffc00);
    puVar4 = (uchar *)__archive_read_filter_ahead(filter,uVar7 << (uVar7 < lVar6 + 0xa0U),avail);
    *b = puVar4;
    if (puVar4 == (uchar *)0x0) {
      if (*avail <= *ravail) {
        return 0;
      }
      puVar4 = (uchar *)__archive_read_filter_ahead(filter,*avail,avail);
      bVar2 = true;
    }
    else {
      bVar2 = false;
    }
    sVar1 = *avail;
    *nbytes_read = sVar1;
    *ravail = sVar1;
    *b = puVar4 + (lVar6 - sVar3);
    lVar8 = *avail - (lVar6 - sVar3);
    *avail = lVar8;
    sVar5 = get_line(puVar4 + lVar6,lVar8 - sVar3,nl);
    lVar6 = 0;
    if (-1 < sVar5) {
      lVar6 = sVar3;
    }
    sVar3 = lVar6 + sVar5;
  }
  return sVar3;
}

Assistant:

static ssize_t
bid_get_line(struct archive_read_filter *filter,
    const unsigned char **b, ssize_t *avail, ssize_t *ravail,
    ssize_t *nl, size_t* nbytes_read)
{
	ssize_t len;
	int quit;
	
	quit = 0;
	if (*avail == 0) {
		*nl = 0;
		len = 0;
	} else
		len = get_line(*b, *avail, nl);

	/*
	 * Read bytes more while it does not reach the end of line.
	 */
	while (*nl == 0 && len == *avail && !quit &&
	    *nbytes_read < UUENCODE_BID_MAX_READ) {
		ssize_t diff = *ravail - *avail;
		size_t nbytes_req = (*ravail+1023) & ~1023U;
		ssize_t tested;

		/* Increase reading bytes if it is not enough to at least
		 * new two lines. */
		if (nbytes_req < (size_t)*ravail + 160)
			nbytes_req <<= 1;

		*b = __archive_read_filter_ahead(filter, nbytes_req, avail);
		if (*b == NULL) {
			if (*ravail >= *avail)
				return (0);
			/* Reading bytes reaches the end of a stream. */
			*b = __archive_read_filter_ahead(filter, *avail, avail);
			quit = 1;
		}
		*nbytes_read = *avail;
		*ravail = *avail;
		*b += diff;
		*avail -= diff;
		tested = len;/* Skip some bytes we already determined. */
		len = get_line(*b + tested, *avail - tested, nl);
		if (len >= 0)
			len += tested;
	}
	return (len);
}